

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapeprism.cpp
# Opt level: O2

int pzshape::TPZShapePrism::NConnectShapeF(int side,int order)

{
  int iVar1;
  ostream *poVar2;
  
  if (side < 6) {
    return 1;
  }
  if ((uint)side < 0xf) {
    iVar1 = order + -1;
  }
  else if ((side == 0x13) || (side == 0xf)) {
    iVar1 = ((order + -1) * (order + -2)) / 2;
  }
  else if ((uint)side < 0x13) {
    iVar1 = (order + -1) * (order + -1);
  }
  else if (side == 0x14) {
    iVar1 = ((order + -2) * (order + -1) * (order + -1)) / 2;
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cerr,
                             "TPZShapePrism::NConnectShapeF, bad parameter side ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,side);
    std::endl<char,std::char_traits<char>>(poVar2);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int TPZShapePrism::NConnectShapeF(int side, int order) {
		if(side<6) return 1;//0 a 4
		if(side<15) return (order-1);//6 a 14
		if(side==15 || side==19) {
			return ((order-2)*(order-1)/2);
		}
		if(side>15 && side<19) {//16,17,18
			return ((order-1)*(order-1));
		}
		if(side==20) {
			return ((order-2)*(order-1)*(order-1)/2);
		}
		PZError << "TPZShapePrism::NConnectShapeF, bad parameter side " << side << endl;
		return 0;
	}